

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O1

void __thiscall
dynet::BidirectionalTreeLSTMBuilder::BidirectionalTreeLSTMBuilder
          (BidirectionalTreeLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  ParameterCollection *this_00;
  string local_220;
  undefined1 local_200 [88];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a8;
  ParameterCollectionStorage *local_170;
  __node_base _Stack_168;
  
  (this->super_TreeLSTMBuilder).super_RNNBuilder.cur = -1;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.sm.q_ = CREATED;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder._vptr_RNNBuilder =
       (_func_int **)&PTR__BidirectionalTreeLSTMBuilder_005c06c8;
  VanillaLSTMBuilder::VanillaLSTMBuilder(&this->fwd_node_builder);
  VanillaLSTMBuilder::VanillaLSTMBuilder(&this->rev_node_builder);
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->local_model;
  ParameterCollection::ParameterCollection(this_00);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"bidirectional-tree-lstm-builder","");
  ParameterCollection::add_subcollection((ParameterCollection *)local_200,model,&local_220);
  std::__cxx11::string::_M_assign((string *)this_00);
  if ((ParameterCollection *)local_200 != this_00) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).name_cntr,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_200 + 0x20));
    if ((ParameterCollection *)local_200 != this_00) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&(this->local_model).collec_name_cntr,&local_1a8);
    }
  }
  (this->local_model).storage = local_170;
  (this->local_model).parent = (ParameterCollection *)_Stack_168._M_nxt;
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  VanillaLSTMBuilder::VanillaLSTMBuilder
            ((VanillaLSTMBuilder *)local_200,layers,input_dim,hidden_dim >> 1,this_00,false);
  VanillaLSTMBuilder::operator=(&this->fwd_node_builder,(VanillaLSTMBuilder *)local_200);
  VanillaLSTMBuilder::~VanillaLSTMBuilder((VanillaLSTMBuilder *)local_200);
  VanillaLSTMBuilder::VanillaLSTMBuilder
            ((VanillaLSTMBuilder *)local_200,layers,input_dim,hidden_dim >> 1,this_00,false);
  VanillaLSTMBuilder::operator=(&this->rev_node_builder,(VanillaLSTMBuilder *)local_200);
  VanillaLSTMBuilder::~VanillaLSTMBuilder((VanillaLSTMBuilder *)local_200);
  return;
}

Assistant:

BidirectionalTreeLSTMBuilder::BidirectionalTreeLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) {
  DYNET_ASSERT(hidden_dim % 2 == 0, "Failed dimension check in TreeLSTMBuilder");
  local_model = model.add_subcollection("bidirectional-tree-lstm-builder");
  fwd_node_builder = LSTMBuilder(layers, input_dim, hidden_dim / 2, local_model);
  rev_node_builder = LSTMBuilder(layers, input_dim, hidden_dim / 2, local_model);
}